

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_copy(jit_State *J,TRef trdst,TRef trsrc,TRef trlen,CType *ct)

{
  MSize MVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  jit_State *in_RDI;
  CType *in_R8;
  CType *cct;
  CTState *cts;
  int needxbar;
  IRType tp;
  CTSize len;
  CTSize step;
  MSize mlp;
  CRecMemList ml [16];
  jit_State *in_stack_fffffffffffffe58;
  TRef in_stack_fffffffffffffe60;
  MSize mlp_00;
  IRType tp_00;
  uint len_00;
  uint step_00;
  CRecMemList local_188 [14];
  CType *local_60;
  
  if (0x7fff < (in_ECX & 0xffff)) goto LAB_0015cc99;
  step_00 = 1;
  len_00 = (in_RDI->cur).ir[in_ECX & 0xffff].field_1.op12;
  tp_00 = IRT_CDATA;
  mlp_00 = 0;
  if (len_00 == 0) {
    return;
  }
  if (0x80 < len_00) goto LAB_0015cc99;
  if (in_R8 == (CType *)0x0) {
LAB_0015cbab:
    mlp_00 = 1;
    step_00 = 8;
LAB_0015cbbb:
    MVar1 = crec_copy_unroll(local_188,len_00,step_00,tp_00);
  }
  else {
    in_stack_fffffffffffffe58 = (jit_State *)(ulong)in_RDI[-1].bpropcache[9].mode;
    local_60 = in_R8;
    if (in_R8->info >> 0x1c == 3) {
      do {
        local_60 = *(CType **)&in_stack_fffffffffffffe58->cur + (local_60->info & 0xffff);
      } while (local_60->info >> 0x1c == 8);
      tp_00 = crec_ct2irt((CTState *)in_stack_fffffffffffffe58,local_60);
      if (tp_00 == IRT_CDATA) goto LAB_0015cbab;
      step_00 = (uint)"\x04\x04\x04\b\x04\x04\x04\x04\x04\b\x04\x04\x04\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                      [tp_00];
      goto LAB_0015cbbb;
    }
    if ((in_R8->info & 0x800000) != 0) goto LAB_0015cbab;
    MVar1 = crec_copy_struct((CRecMemList *)0x1,(CTState *)CONCAT44(len_00,10),
                             (CType *)(ulong)in_stack_fffffffffffffe60);
  }
  if (MVar1 != 0) {
    crec_copy_emit((jit_State *)CONCAT44(MVar1,step_00),(CRecMemList *)CONCAT44(len_00,tp_00),mlp_00
                   ,in_stack_fffffffffffffe60,(TRef)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    if (mlp_00 == 0) {
      return;
    }
    (in_RDI->fold).ins.field_0.ot = 0x5400;
    (in_RDI->fold).ins.field_0.op1 = 0;
    (in_RDI->fold).ins.field_0.op2 = 0;
    lj_opt_fold(in_stack_fffffffffffffe58);
    return;
  }
LAB_0015cc99:
  lj_ir_call(in_RDI,IRCALL_memcpy,(ulong)in_ESI,(ulong)in_EDX,(ulong)in_ECX);
  (in_RDI->fold).ins.field_0.ot = 0x5400;
  (in_RDI->fold).ins.field_0.op1 = 0;
  (in_RDI->fold).ins.field_0.op2 = 0;
  lj_opt_fold(in_stack_fffffffffffffe58);
  return;
}

Assistant:

static void crec_copy(jit_State *J, TRef trdst, TRef trsrc, TRef trlen,
		      CType *ct)
{
  if (tref_isk(trlen)) {  /* Length must be constant. */
    CRecMemList ml[CREC_COPY_MAXUNROLL];
    MSize mlp = 0;
    CTSize step = 1, len = (CTSize)IR(tref_ref(trlen))->i;
    IRType tp = IRT_CDATA;
    int needxbar = 0;
    if (len == 0) return;  /* Shortcut. */
    if (len > CREC_COPY_MAXLEN) goto fallback;
    if (ct) {
      CTState *cts = ctype_ctsG(J2G(J));
      lua_assert(ctype_isarray(ct->info) || ctype_isstruct(ct->info));
      if (ctype_isarray(ct->info)) {
	CType *cct = ctype_rawchild(cts, ct);
	tp = crec_ct2irt(cts, cct);
	if (tp == IRT_CDATA) goto rawcopy;
	step = lj_ir_type_size[tp];
	lua_assert((len & (step-1)) == 0);
      } else if ((ct->info & CTF_UNION)) {
	step = (1u << ctype_align(ct->info));
	goto rawcopy;
      } else {
	mlp = crec_copy_struct(ml, cts, ct);
	goto emitcopy;
      }
    } else {
    rawcopy:
      needxbar = 1;
      if (LJ_TARGET_UNALIGNED || step >= CTSIZE_PTR)
	step = CTSIZE_PTR;
    }
    mlp = crec_copy_unroll(ml, len, step, tp);
  emitcopy:
    if (mlp) {
      crec_copy_emit(J, ml, mlp, trdst, trsrc);
      if (needxbar)
	emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
      return;
    }
  }
fallback:
  /* Call memcpy. Always needs a barrier to disable alias analysis. */
  lj_ir_call(J, IRCALL_memcpy, trdst, trsrc, trlen);
  emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
}